

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O0

void __thiscall Percentile::Percentile(Percentile *this,shared_ptr<Launcher> *launcher)

{
  undefined8 *in_RDI;
  Launcher *in_stack_ffffffffffffff88;
  Application *in_stack_ffffffffffffff90;
  shared_ptr<QueryCompiler> *this_00;
  shared_ptr<QueryCompiler> local_20 [2];
  
  Application::Application(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__Percentile_0037faa0;
  std::__cxx11::string::string((string *)(in_RDI + 10));
  std::shared_ptr<QueryCompiler>::shared_ptr((shared_ptr<QueryCompiler> *)0x24d012);
  std::shared_ptr<TreeDecomposition>::shared_ptr((shared_ptr<TreeDecomposition> *)0x24d025);
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x24d04a);
  Launcher::getCompiler(in_stack_ffffffffffffff88);
  this_00 = local_20;
  std::shared_ptr<QueryCompiler>::operator=
            (this_00,(shared_ptr<QueryCompiler> *)in_stack_ffffffffffffff88);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x24d07b);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x24d085);
  Launcher::getTreeDecomposition(in_stack_ffffffffffffff88);
  std::shared_ptr<TreeDecomposition>::operator=
            ((shared_ptr<TreeDecomposition> *)this_00,
             (shared_ptr<TreeDecomposition> *)in_stack_ffffffffffffff88);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x24d0b4);
  return;
}

Assistant:

Percentile::Percentile(shared_ptr<Launcher> launcher)
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();
}